

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O2

void __thiscall CScheduler::scheduleFromNow(CScheduler *this,Function f,milliseconds delta)

{
  long lVar1;
  _Manager_type p_Var2;
  Function f_00;
  long in_FS_OFFSET;
  undefined8 uVar3;
  undefined8 uVar4;
  _Manager_type p_Var5;
  _Invoker_type p_Var6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (void *)0x0;
  uVar4 = 0;
  p_Var6 = *(_Invoker_type *)(delta.__r + 0x18);
  p_Var2 = *(_Manager_type *)(delta.__r + 0x10);
  p_Var5 = (_Manager_type)0x0;
  if (p_Var2 != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)delta.__r;
    uVar4 = *(undefined8 *)(delta.__r + 8);
    *(undefined8 *)(delta.__r + 0x10) = 0;
    *(undefined8 *)(delta.__r + 0x18) = 0;
    p_Var5 = p_Var2;
  }
  std::chrono::_V2::steady_clock::now();
  f_00.super__Function_base._M_functor._8_8_ = uVar4;
  f_00.super__Function_base._M_functor._M_unused._M_object = (void *)uVar3;
  f_00.super__Function_base._M_manager = p_Var5;
  f_00._M_invoker = p_Var6;
  schedule(this,f_00,(time_point)&stack0xffffffffffffffc8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!newTaskMutex)
    {
        schedule(std::move(f), std::chrono::steady_clock::now() + delta);
    }